

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall
kj::VectorOutputStream::write(VectorOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte *pbVar1;
  Fault FVar2;
  uchar *puVar3;
  uchar *puVar4;
  undefined4 in_register_00000034;
  long local_30;
  Fault local_28;
  Fault f;
  size_t size_local;
  void *src_local;
  VectorOutputStream *this_local;
  
  f.exception = (Exception *)__buf;
  if (((byte *)CONCAT44(in_register_00000034,__fd) == this->fillPos) &&
     (puVar4 = this->fillPos, puVar3 = Array<unsigned_char>::end(&this->vector),
     FVar2.exception = f.exception, puVar4 != puVar3)) {
    puVar4 = Array<unsigned_char>::end(&this->vector);
    if (FVar2.exception <= (Exception *)(puVar4 + -(long)this->fillPos)) {
      this->fillPos = this->fillPos + (long)((f.exception)->trace + -10);
      return (ssize_t)this;
    }
    puVar4 = Array<unsigned_char>::end(&this->vector);
    local_30 = (long)puVar4 - (long)this->fillPos;
    _::Debug::Fault::Fault<kj::Exception::Type,unsigned_long&,unsigned_char*&,long>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
               ,0x130,FAILED,"size <= vector.end() - fillPos",
               "size, fillPos, vector.end() - fillPos",(unsigned_long *)&f,&this->fillPos,&local_30)
    ;
    _::Debug::Fault::fatal(&local_28);
  }
  puVar4 = Array<unsigned_char>::end(&this->vector);
  if ((Exception *)(puVar4 + -(long)this->fillPos) < f.exception) {
    pbVar1 = this->fillPos;
    puVar4 = Array<unsigned_char>::begin(&this->vector);
    grow(this,((long)pbVar1 - (long)puVar4) + (long)f.exception);
  }
  memcpy(this->fillPos,(byte *)CONCAT44(in_register_00000034,__fd),(size_t)f.exception);
  this->fillPos = this->fillPos + (long)((f.exception)->trace + -10);
  return (ssize_t)this;
}

Assistant:

void VectorOutputStream::write(const void* src, size_t size) {
  if (src == fillPos && fillPos != vector.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= vector.end() - fillPos, size, fillPos, vector.end() - fillPos);
    fillPos += size;
  } else {
    if (vector.end() - fillPos < size) {
      grow(fillPos - vector.begin() + size);
    }

    memcpy(fillPos, src, size);
    fillPos += size;
  }
}